

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ascii-parser.cc
# Opt level: O3

bool __thiscall
tinyusdz::ascii::AsciiParser::LookCharN
          (AsciiParser *this,size_t n,vector<char,_std::allocator<char>_> *nc)

{
  ulong uVar1;
  ulong uVar2;
  size_t nbytes;
  size_t __n;
  StreamReader *pSVar3;
  vector<char,_std::allocator<char>_> buf;
  allocator_type local_51;
  vector<char,_std::allocator<char>_> *local_50;
  vector<char,_std::allocator<char>_> local_48;
  
  local_50 = nc;
  ::std::vector<char,_std::allocator<char>_>::vector(&local_48,n,&local_51);
  pSVar3 = this->_sr;
  uVar2 = pSVar3->length_;
  uVar1 = pSVar3->idx_;
  __n = uVar2 - uVar1;
  if (n + uVar1 <= uVar2) {
    __n = n;
  }
  if (__n - 1 < n) {
    memcpy(local_48.super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data.
           _M_start,pSVar3->binary_ + uVar1,__n);
    pSVar3->idx_ = pSVar3->idx_ + __n;
    ::std::vector<char,_std::allocator<char>_>::operator=(local_50,&local_48);
    pSVar3 = this->_sr;
    uVar2 = pSVar3->length_;
  }
  if (uVar1 <= uVar2) {
    pSVar3->idx_ = uVar1;
  }
  if (local_48.super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data.
      _M_start != (pointer)0x0) {
    operator_delete(local_48.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)local_48.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)local_48.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  return __n - 1 < n;
}

Assistant:

bool AsciiParser::LookCharN(size_t n, std::vector<char> *nc) {
  std::vector<char> buf(n);

  auto loc = CurrLoc();

  bool ok = _sr->read(n, n, reinterpret_cast<uint8_t *>(buf.data()));
  if (ok) {
    (*nc) = buf;
  }

  SeekTo(loc);

  return ok;
}